

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O0

void pstore::command_line::details::report_unknown_option<std::__cxx11::ostringstream>
               (string *program_name,string *arg_name,string *value,
               basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs)

{
  char *pcVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  czstring pcVar5;
  options_container *all_options;
  option **ppoVar6;
  size_t sVar7;
  ulong uVar8;
  allocator local_91;
  string local_90;
  char *local_70;
  czstring dashes;
  undefined1 local_58 [8];
  string nearest_string;
  maybe<pstore::command_line::option_*,_void> best_option;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs_local;
  string *value_local;
  string *arg_name_local;
  string *program_name_local;
  
  psVar3 = stream_trait<char>::out_string(program_name);
  poVar4 = std::operator<<((ostream *)errs,(string *)psVar3);
  pcVar5 = stream_trait<char>::out_text(": Unknown command line argument \'");
  poVar4 = std::operator<<(poVar4,pcVar5);
  psVar3 = stream_trait<char>::out_string(arg_name);
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  pcVar5 = stream_trait<char>::out_text("\'\n");
  std::operator<<(poVar4,pcVar5);
  all_options = option::all_abi_cxx11_();
  lookup_nearest_option
            ((maybe<pstore::command_line::option_*,_void> *)((long)&nearest_string.field_2 + 8),
             arg_name,all_options);
  bVar2 = maybe::operator_cast_to_bool((maybe *)(nearest_string.field_2._M_local_buf + 8));
  if (bVar2) {
    ppoVar6 = maybe<pstore::command_line::option_*,_void>::operator*
                        ((maybe<pstore::command_line::option_*,_void> *)
                         ((long)&nearest_string.field_2 + 8));
    psVar3 = option::name_abi_cxx11_(*ppoVar6);
    std::__cxx11::string::string((string *)local_58,(string *)psVar3);
    sVar7 = utf::length((string *)local_58);
    local_70 = "--";
    if (sVar7 < 2) {
      local_70 = "-";
    }
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)local_58,'=');
      std::__cxx11::string::operator+=((string *)local_58,(string *)value);
    }
    pcVar5 = stream_trait<char>::out_text("Did you mean \'");
    poVar4 = std::operator<<((ostream *)errs,pcVar5);
    pcVar1 = local_70;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,pcVar1,&local_91);
    psVar3 = stream_trait<char>::out_string(&local_90);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    psVar3 = stream_trait<char>::out_string((string *)local_58);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    pcVar5 = stream_trait<char>::out_text("\'?\n");
    std::operator<<(poVar4,pcVar5);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string((string *)local_58);
  }
  maybe<pstore::command_line::option_*,_void>::~maybe
            ((maybe<pstore::command_line::option_*,_void> *)((long)&nearest_string.field_2 + 8));
  return;
}

Assistant:

void report_unknown_option (std::string const & program_name,
                                        std::string const & arg_name, std::string const & value,
                                        ErrorStream & errs) {
                using str = stream_trait<typename ErrorStream::char_type>;
                errs << str::out_string (program_name)
                     << str::out_text (": Unknown command line argument '")
                     << str::out_string (arg_name) << str::out_text ("'\n");

                if (maybe<option *> const best_option =
                        lookup_nearest_option (arg_name, option::all ())) {
                    std::string nearest_string = (*best_option)->name ();
                    gsl::czstring const dashes = utf::length (nearest_string) < 2U ? "-" : "--";
                    if (!value.empty ()) {
                        nearest_string += '=';
                        nearest_string += value;
                    }
                    errs << str::out_text ("Did you mean '") << str::out_string (dashes)
                         << str::out_string (nearest_string) << str::out_text ("'?\n");
                }
            }